

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

SharedEndpoint * __thiscall
soul::PoolAllocator::allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
          (PoolAllocator *this,Expression *args)

{
  Expression *pEVar1;
  void **this_00;
  _lambda_void___1_ local_29;
  void **local_28;
  SharedEndpoint *newObject;
  PoolItem *newItem;
  Expression *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (Expression *)this;
  newObject = (SharedEndpoint *)allocateSpaceForObject(this,8);
  this_00 = &((PoolItem *)newObject)->item;
  AST::Connection::SharedEndpoint::SharedEndpoint((SharedEndpoint *)this_00,(Expression *)newItem);
  local_28 = this_00;
  pEVar1 = (Expression *)
           allocate(soul::AST::Expression&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (&local_29);
  newObject[1].endpoint.object = pEVar1;
  return (SharedEndpoint *)local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }